

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O0

void __thiscall Fir1::Fir1(Fir1 *this,char *coeffFile,uint number_of_taps)

{
  int iVar1;
  FILE *__stream;
  invalid_argument *this_00;
  uint in_EDX;
  char *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int r;
  double v;
  uint i;
  FILE *f;
  vector<double,_std::allocator<double>_> tmpCoefficients;
  value_type *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  Fir1 *in_stack_ffffffffffffffa0;
  undefined8 local_50;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffbc;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  
  *(undefined4 *)
   ((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x101a74);
  __stream = fopen(in_RSI,"rt");
  if (__stream == (FILE *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Could not open file.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  for (uVar2 = 0; uVar2 < in_EDX || in_EDX == 0; uVar2 = uVar2 + 1) {
    local_50 = 0;
    iVar1 = __isoc99_fscanf(__stream,"%lf\n",&local_50);
    if (iVar1 < 1) break;
    std::vector<double,_std::allocator<double>_>::push_back(in_RDI,in_stack_ffffffffffffff78);
  }
  fclose(__stream);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffc0,
             (vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffffbc,uVar2));
  initWithVector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  return;
}

Assistant:

Fir1::Fir1(const char* coeffFile, unsigned number_of_taps) {

	std::vector<double> tmpCoefficients;

	FILE* f=fopen(coeffFile,"rt");
	if (!f) {
		throw std::invalid_argument("Could not open file.");
	}
	for(unsigned int i=0;(i<number_of_taps)||(number_of_taps==0);i++) {
		double v = 0;
		int r = fscanf(f,"%lf\n",&v);
		if (r < 1) break;
		tmpCoefficients.push_back(v);
	}
	fclose(f);
	initWithVector(tmpCoefficients);
}